

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O1

bc_slist_t * bc_slist_sort(bc_slist_t *l,bc_sort_func_t cmp)

{
  void *pvVar1;
  int iVar2;
  bc_slist_t *pbVar3;
  bool bVar4;
  _bc_slist_t *p_Var5;
  bc_slist_t *pbVar6;
  
  if (l == (bc_slist_t *)0x0) {
    l = (bc_slist_t *)0x0;
  }
  else {
    pbVar6 = (bc_slist_t *)0x0;
    do {
      bVar4 = false;
      pbVar3 = l->next;
      p_Var5 = l;
      while (pbVar3 != pbVar6) {
        iVar2 = (*cmp)(p_Var5->data,pbVar3->data);
        if (0 < iVar2) {
          pvVar1 = p_Var5->data;
          p_Var5->data = p_Var5->next->data;
          p_Var5->next->data = pvVar1;
          bVar4 = true;
        }
        p_Var5 = p_Var5->next;
        pbVar3 = p_Var5->next;
      }
      pbVar6 = p_Var5;
    } while (bVar4);
  }
  return l;
}

Assistant:

bc_slist_t*
bc_slist_sort(bc_slist_t *l, bc_sort_func_t cmp)
{
    if (l == NULL) {
        return NULL;
    }

    bool swapped = false;
    bc_slist_t *lptr = NULL;
    bc_slist_t *rptr = NULL;

    do {
        swapped = false;
        lptr = l;

        while (lptr->next != rptr) {
            if (0 < cmp(lptr->data, lptr->next->data)) {
                void *tmp = lptr->data;
                lptr->data = lptr->next->data;
                lptr->next->data = tmp;
                swapped = true;
            }

            lptr = lptr->next;
        }

        rptr = lptr;
    } while(swapped);

    return l;
}